

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O3

Material * rw::Material::streamRead(Stream *stream)

{
  undefined4 uVar1;
  bool bVar2;
  Material *this;
  Texture *pTVar3;
  SurfaceProperties *data;
  uint32 version;
  uint32 length;
  uint local_28;
  uint32 local_24;
  undefined1 local_20 [4];
  RGBA local_1c;
  int local_14;
  
  bVar2 = findChunk(stream,1,(uint32 *)0x0,&local_28);
  if (!bVar2) {
    streamRead();
    return (Material *)0x0;
  }
  (*stream->_vptr_Stream[4])(stream,local_20,0x10);
  this = create();
  if (this == (Material *)0x0) {
    return (Material *)0x0;
  }
  this->color = local_1c;
  data = &this->surfaceProps;
  if (local_28 < 0x30400) {
    (this->surfaceProps).diffuse = DAT_0014a888;
    uVar1 = defaultSurfaceProps._4_4_;
    data->ambient = (float32)(undefined4)defaultSurfaceProps;
    data->specular = (float32)uVar1;
  }
  else {
    Stream::read32(stream,data,0xc);
  }
  if (local_14 != 0) {
    bVar2 = findChunk(stream,6,&local_24,(uint32 *)0x0);
    if (!bVar2) {
      streamRead();
      goto LAB_0010cb83;
    }
    pTVar3 = Texture::streamRead(stream);
    this->texture = pTVar3;
  }
  materialRights = 0;
  bVar2 = PluginList::streamRead((PluginList *)&s_plglist,stream,this);
  if (bVar2) {
    if (materialRights != 0) {
      PluginList::assertRights((PluginList *)&s_plglist,this,materialRights,DAT_0014b140);
      return this;
    }
    return this;
  }
LAB_0010cb83:
  destroy(this);
  return (Material *)0x0;
}

Assistant:

Material*
Material::streamRead(Stream *stream)
{
	uint32 length, version;
	MatStreamData buf;

	if(!findChunk(stream, ID_STRUCT, nil, &version)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	stream->read8(&buf, sizeof(buf));
	RGBA col = buf.color;
	memNative32(&buf, sizeof(buf));
	buf.color = col;
	Material *mat = Material::create();
	if(mat == nil)
		return nil;
	mat->color = buf.color;
	if(version < 0x30400)
		mat->surfaceProps = defaultSurfaceProps;
	else
		stream->read32(&mat->surfaceProps, sizeof(SurfaceProperties));
	if(buf.textured){
		if(!findChunk(stream, ID_TEXTURE, &length, nil)){
			RWERROR((ERR_CHUNK, "TEXTURE"));
			goto fail;
		}
		mat->texture = Texture::streamRead(stream);
	}

	materialRights[0] = 0;
	if(!s_plglist.streamRead(stream, mat))
		goto fail;
	if(materialRights[0])
		s_plglist.assertRights(mat, materialRights[0], materialRights[1]);
	return mat;

fail:
	mat->destroy();
	return nil;
}